

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O3

void __thiscall SymbolData::writeNocashSym(SymbolData *this)

{
  pointer pSVar1;
  pointer pNVar2;
  pointer pNVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  int iVar7;
  pointer pSVar8;
  size_t *psVar9;
  _Base_ptr p_Var10;
  pointer pSVar11;
  long lVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  size_type sVar13;
  unsigned_long *in_R8;
  ulong uVar14;
  vector<NocashSymEntry,_std::allocator<NocashSymEntry>_> entries;
  size_t size;
  TextFile file;
  string local_350;
  pointer local_330;
  vector<NocashSymEntry,_std::allocator<NocashSymEntry>_> local_328;
  undefined1 local_310 [24];
  undefined1 local_2f8 [8];
  _Alloc_hider local_2f0;
  size_type local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0 [31];
  path local_e8 [5];
  
  bVar6 = ghc::filesystem::path::empty(&this->nocashSymFileName);
  if (!bVar6) {
    local_328.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_328.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_328.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pSVar8 = (this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>._M_impl.
        super__Vector_impl_data._M_finish != pSVar8) {
      uVar14 = 0;
      local_310._16_8_ = this;
      do {
        local_330 = pSVar8 + uVar14;
        pSVar11 = pSVar8[uVar14].symbols.
                  super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_310._8_8_ = uVar14;
        if (pSVar8[uVar14].symbols.super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>
            ._M_impl.super__Vector_impl_data._M_finish != pSVar11) {
          uVar14 = 0;
          do {
            local_2f0._M_p = (pointer)local_2e0;
            pSVar11 = pSVar11 + uVar14;
            local_310._0_8_ = (pointer)0x0;
            pSVar1 = (local_330->functions).
                     super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar12 = (long)(local_330->functions).
                           super__Vector_base<SymDataFunction,_std::allocator<SymDataFunction>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1;
            if (lVar12 != 0) {
              lVar12 = lVar12 >> 4;
              lVar12 = lVar12 + (ulong)(lVar12 == 0);
              psVar9 = &pSVar1->size;
              do {
                if (((SymDataFunction *)(psVar9 + -1))->address == pSVar11->address) {
                  local_310._0_8_ = *psVar9;
                  bVar6 = (pointer)local_310._0_8_ != (pointer)0x0;
                  goto LAB_00140115;
                }
                psVar9 = psVar9 + 2;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
            bVar6 = false;
LAB_00140115:
            local_2e8 = 0;
            local_2e0[0]._M_local_buf[0] = '\0';
            local_2f8 = (undefined1  [8])pSVar11->address;
            if ((bVar6) && (1 < this->nocashSymVersion)) {
              tinyformat::format<std::__cxx11::string,unsigned_long>
                        (&local_350,(tinyformat *)"%s,%08X",(char *)pSVar11,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_310,in_R8);
              std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_350);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_350._M_dataplus._M_p != &local_350.field_2) {
                operator_delete(local_350._M_dataplus._M_p,
                                local_350.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              std::__cxx11::string::_M_assign((string *)&local_2f0);
            }
            sVar5 = local_2e8;
            _Var4._M_p = local_2f0._M_p;
            if ((this->nocashSymVersion == 1) && (local_2e8 != 0)) {
              sVar13 = 0;
              do {
                iVar7 = tolower((int)_Var4._M_p[sVar13]);
                _Var4._M_p[sVar13] = (char)iVar7;
                sVar13 = sVar13 + 1;
              } while (sVar5 != sVar13);
            }
            std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>::push_back
                      (&local_328,(value_type *)local_2f8);
            this = (SymbolData *)local_310._16_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_p != local_2e0) {
              operator_delete(local_2f0._M_p,
                              CONCAT71(local_2e0[0]._M_allocated_capacity._1_7_,
                                       local_2e0[0]._M_local_buf[0]) + 1);
            }
            uVar14 = uVar14 + 1;
            pSVar11 = (local_330->symbols).
                      super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl.
                      super__Vector_impl_data._M_start;
          } while (uVar14 < (ulong)(((long)(local_330->symbols).
                                           super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)pSVar11 >> 3) * -0x3333333333333333));
        }
        p_Var10 = (local_330->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_330 = (pointer)&(local_330->data)._M_t._M_impl.super__Rb_tree_header;
        if ((pointer)p_Var10 != local_330) {
          do {
            local_2e8 = 0;
            local_2e0[0]._M_local_buf[0] = '\0';
            local_2f8 = *(undefined1 (*) [8])(p_Var10 + 1);
            local_2f0._M_p = (pointer)local_2e0;
            switch(*(undefined4 *)&p_Var10[1]._M_left) {
            case 0:
              tinyformat::format<unsigned_long>
                        (&local_350,".byt:%04X",(unsigned_long *)&p_Var10[1]._M_parent);
              break;
            case 1:
              tinyformat::format<unsigned_long>
                        (&local_350,".wrd:%04X",(unsigned_long *)&p_Var10[1]._M_parent);
              break;
            case 2:
              tinyformat::format<unsigned_long>
                        (&local_350,".dbl:%04X",(unsigned_long *)&p_Var10[1]._M_parent);
              break;
            case 3:
              tinyformat::format<unsigned_long>
                        (&local_350,".dbl:%04X",(unsigned_long *)&p_Var10[1]._M_parent);
              break;
            case 4:
              tinyformat::format<unsigned_long>
                        (&local_350,".asc:%04X",(unsigned_long *)&p_Var10[1]._M_parent);
              break;
            default:
              goto switchD_0014026d_default;
            }
            std::__cxx11::string::operator=((string *)&local_2f0,(string *)&local_350);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_350._M_dataplus._M_p != &local_350.field_2) {
              operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1
                             );
            }
switchD_0014026d_default:
            std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>::push_back
                      (&local_328,(value_type *)local_2f8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_p != local_2e0) {
              operator_delete(local_2f0._M_p,
                              CONCAT71(local_2e0[0]._M_allocated_capacity._1_7_,
                                       local_2e0[0]._M_local_buf[0]) + 1);
            }
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
          } while ((pointer)p_Var10 != local_330);
        }
        pNVar3 = local_328.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pNVar2 = local_328.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar14 = local_310._8_8_ + 1;
        pSVar8 = (this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      } while (uVar14 < (ulong)(((long)(this->modules).
                                       super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar8 >>
                                3) * 0x4ec4ec4ec4ec4ec5));
      if (local_328.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_328.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        uVar14 = ((long)local_328.
                        super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_328.
                        super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
        lVar12 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<NocashSymEntry*,std::vector<NocashSymEntry,std::allocator<NocashSymEntry>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_328.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_328.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>.
                   _M_impl.super__Vector_impl_data._M_finish,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<NocashSymEntry*,std::vector<NocashSymEntry,std::allocator<NocashSymEntry>>>,__gnu_cxx::__ops::_Iter_less_iter>
                  (pNVar2,pNVar3);
      }
    }
    TextFile::TextFile((TextFile *)local_2f8);
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    iVar7 = TextFile::open((TextFile *)local_2f8,(char *)this,1);
    if ((char)iVar7 == '\0') {
      ghc::filesystem::path::u8string_abi_cxx11_(&local_350,local_e8);
      Logger::printError<std::__cxx11::string>((Logger *)0x1,0x189910,(char *)&local_350,args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      TextFile::writeLine((TextFile *)local_2f8,"00000000 0");
      __buf = extraout_RDX;
      if (local_328.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_328.super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar12 = 8;
        uVar14 = 0;
        do {
          TextFile::writeFormat<long,std::__cxx11::string>
                    ((TextFile *)local_2f8,"%08X %s\n",
                     (long *)((long)local_328.
                                    super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar12 + -8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(local_328.
                              super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>.
                              _M_impl.super__Vector_impl_data._M_start)->address + lVar12));
          uVar14 = uVar14 + 1;
          lVar12 = lVar12 + 0x28;
          __buf = extraout_RDX_00;
        } while (uVar14 < (ulong)(((long)local_328.
                                         super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_328.
                                         super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x3333333333333333));
      }
      iVar7 = 0x189940;
      TextFile::write((TextFile *)local_2f8,0x189940,__buf,
                      (size_t)local_328.
                              super__Vector_base<NocashSymEntry,_std::allocator<NocashSymEntry>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      TextFile::close((TextFile *)local_2f8,iVar7);
    }
    TextFile::~TextFile((TextFile *)local_2f8);
    std::vector<NocashSymEntry,_std::allocator<NocashSymEntry>_>::~vector(&local_328);
  }
  return;
}

Assistant:

void SymbolData::writeNocashSym()
{
	if (nocashSymFileName.empty())
		return;

	std::vector<NocashSymEntry> entries;
	for (size_t k = 0; k < modules.size(); k++)
	{
		SymDataModule& module = modules[k];
		for (size_t i = 0; i < module.symbols.size(); i++)
		{
			SymDataSymbol& sym = module.symbols[i];
			
			size_t size = 0;
			for (size_t f = 0; f < module.functions.size(); f++)
			{
				if (module.functions[f].address == sym.address)
				{
					size = module.functions[f].size;
					break;
				}
			}

			NocashSymEntry entry;
			entry.address = sym.address;

			if (size != 0 && nocashSymVersion >= 2)
				entry.text = tfm::format("%s,%08X",sym.name,size);
			else
				entry.text = sym.name;

			if (nocashSymVersion == 1)
				std::transform(entry.text.begin(), entry.text.end(), entry.text.begin(), ::tolower);

			entries.push_back(entry);
		}

		for (const SymDataData& data: module.data)
		{
			NocashSymEntry entry;
			entry.address = data.address;

			switch (data.type)
			{
			case Data8:
				entry.text = tfm::format(".byt:%04X",data.size);
				break;
			case Data16:
				entry.text = tfm::format(".wrd:%04X",data.size);
				break;
			case Data32:
				entry.text = tfm::format(".dbl:%04X",data.size);
				break;
			case Data64:
				entry.text = tfm::format(".dbl:%04X",data.size);
				break;
			case DataAscii:
				entry.text = tfm::format(".asc:%04X",data.size);
				break;
			}

			entries.push_back(entry);
		}
	}

	std::sort(entries.begin(),entries.end());
	
	TextFile file;
	if (!file.open(nocashSymFileName,TextFile::Write,TextFile::ASCII))
	{
		Logger::printError(Logger::Error, "Could not open sym file %s.",file.getFileName().u8string());
		return;
	}
	file.writeLine("00000000 0");

	for (size_t i = 0; i < entries.size(); i++)
	{
		file.writeFormat("%08X %s\n",entries[i].address,entries[i].text);
	}

	file.write("\x1A");
	file.close();
}